

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::set_value(xml_node *this,char_t *rhs)

{
  uint uVar1;
  char **in_RSI;
  long *in_RDI;
  xml_node_type type_;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  char **dest;
  undefined1 local_1;
  
  if (*in_RDI == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (uint)*(undefined8 *)*in_RDI & 0xf;
  }
  if ((((uVar1 == 3) || (uVar1 == 4)) || (uVar1 == 5)) || ((uVar1 == 6 || (uVar1 == 8)))) {
    uVar2 = uVar1;
    dest = in_RSI;
    impl::anon_unknown_0::strlength((char_t *)0xec90a9);
    local_1 = impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
                        (dest,(unsigned_long *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                         (uintptr_t)in_RDI,(char_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                         (size_t)in_RSI);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

PUGI_IMPL_FN bool xml_node::set_value(const char_t* rhs)
	{
		xml_node_type type_ = _root ? PUGI_IMPL_NODETYPE(_root) : node_null;

		if (type_ != node_pcdata && type_ != node_cdata && type_ != node_comment && type_ != node_pi && type_ != node_doctype)
			return false;

		return impl::strcpy_insitu(_root->value, _root->header, impl::xml_memory_page_value_allocated_mask, rhs, impl::strlength(rhs));
	}